

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkFFT.c
# Opt level: O0

complex line_to_number(char *line)

{
  int *piVar1;
  undefined8 extraout_RDX;
  float fVar2;
  complex auVar3;
  complex ret;
  char *line_local;
  
  ret._0_8_ = 0;
  ret._8_8_ = line;
  check_for_number(line);
  piVar1 = __errno_location();
  *piVar1 = 0;
  strtof((char *)ret._8_8_,(char **)(ret + 8));
  ret._0_8_ = 0;
  if ((*(char *)ret._8_8_ != '\n') || (*(char *)ret._8_8_ != ' ')) {
    piVar1 = __errno_location();
    if (*piVar1 == 0) {
      fVar2 = strtof((char *)ret._8_8_,(char **)(ret + 8));
      ret._0_8_ = (double)ret._0_8_ + (double)(fVar2 * 1.0);
      if ((*(char *)ret._8_8_ != '\n') || (*(char *)ret._8_8_ != ' ')) {
        auVar3._0_8_ = __errno_location();
        if (*auVar3._0_8_ == 0) {
          auVar3._8_8_ = extraout_RDX;
          return auVar3;
        }
      }
      fprintf(_stderr,"%s ERROR: ",fileName);
      fprintf(_stderr,"invalid number");
      fprintf(_stderr,"\n");
      exit(1);
    }
  }
  fprintf(_stderr,"%s ERROR: ",fileName);
  fprintf(_stderr,"invalid number");
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

static double complex line_to_number(char* line){
    double complex ret = 0;

    check_for_number(line);

    errno = 0;
    ret = strtof(line, &line);
    if (!(*line != '\n' || *line != ' ') || errno != 0)
    {
        ERROR_EXIT("invalid number");
    }
    ret += strtof(line, &line) * I;

    if (!(*line != '\n' || *line != ' ') || errno != 0)
    {
        ERROR_EXIT("invalid number");
    }

    return ret;
}